

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xpath_node_set_raw::push_back_grow
          (xpath_node_set_raw *this,xpath_node *node,xpath_allocator *alloc)

{
  xml_attribute_struct *pxVar1;
  xpath_node *pxVar2;
  long lVar3;
  size_t old_size;
  
  old_size = (long)this->_eos - (long)this->_begin;
  lVar3 = ((long)old_size >> 4) + ((ulong)((long)old_size >> 4) >> 1) + 1;
  pxVar2 = (xpath_node *)xpath_allocator::reallocate(alloc,this->_begin,old_size,lVar3 * 0x10);
  if (pxVar2 != (xpath_node *)0x0) {
    this->_begin = pxVar2;
    this->_eos = pxVar2 + lVar3;
    this->_end = (xpath_node *)((long)pxVar2 + old_size + 0x10);
    pxVar1 = (node->_attribute)._attr;
    *(undefined8 *)((long)pxVar2 + old_size) = (node->_node)._root;
    ((undefined8 *)((long)pxVar2 + old_size))[1] = pxVar1;
  }
  return;
}

Assistant:

PUGI_IMPL_FN_NO_INLINE void xpath_node_set_raw::push_back_grow(const xpath_node& node, xpath_allocator* alloc)
	{
		size_t capacity = static_cast<size_t>(_eos - _begin);

		// get new capacity (1.5x rule)
		size_t new_capacity = capacity + capacity / 2 + 1;

		// reallocate the old array or allocate a new one
		xpath_node* data = static_cast<xpath_node*>(alloc->reallocate(_begin, capacity * sizeof(xpath_node), new_capacity * sizeof(xpath_node)));
		if (!data) return;

		// finalize
		_begin = data;
		_end = data + capacity;
		_eos = data + new_capacity;

		// push
		*_end++ = node;
	}